

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void muxBlankPL(string *appDir,BlurayHelper *blurayHelper,PIDListMap *pidList,DiskType dt,
               int blankNum)

{
  bool bVar1;
  uint uVar2;
  uint8_t *__file;
  ostream *poVar3;
  VodCoreException *pVVar4;
  ssize_t sVar5;
  mapped_type *this;
  AbstractMuxer *pAVar6;
  size_t __n;
  TSMuxer *local_9a0;
  bool local_91c;
  bool local_91b;
  bool local_91a;
  bool local_919;
  long *local_918;
  vector<double,_std::allocator<double>_> local_908;
  TSMuxer *local_8e8;
  TSMuxer *tsMuxer;
  string dstFile;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  undefined1 local_870 [8];
  MuxerManager muxerManager;
  key_type local_578;
  allocator<char> local_551;
  key_type local_550;
  undefined1 local_530 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  videoParams;
  string local_4f8;
  ostringstream local_4d8 [8];
  ostringstream ss_1;
  int local_360;
  int i;
  ostringstream local_338 [8];
  ostringstream ss;
  undefined1 local_1c0 [8];
  File file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  allocator<char> local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  string tmpFileName;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a0;
  duration<long,_std::ratio<1L,_1000000L>_> local_98;
  rep local_90;
  rep fname_time;
  bool isPal;
  bool isNtsc;
  uint8_t *puStack_80;
  int patternSize;
  uint8_t *pattern;
  MPEGStreamReader *streamReader;
  PMTStreamInfo *streamInfo;
  type *si;
  type *pid;
  _Self local_50;
  const_iterator __end1;
  const_iterator __begin1;
  PIDListMap *__range1;
  double fps;
  uint videoHeight;
  uint videoWidth;
  int blankNum_local;
  DiskType dt_local;
  PIDListMap *pidList_local;
  BlurayHelper *blurayHelper_local;
  string *appDir_local;
  
  fps._4_4_ = 0x780;
  fps._0_4_ = 0x438;
  __range1 = (PIDListMap *)0x4037f9db22d0e560;
  __end1 = std::
           map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
           ::begin(pidList);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<int,_PMTStreamInfo,_std::less<int>,_std::allocator<std::pair<const_int,_PMTStreamInfo>_>_>
       ::end(pidList);
  do {
    bVar1 = std::operator!=(&__end1,&local_50);
    if (!bVar1) {
LAB_002bcfec:
      local_919 = false;
      if ((fps._4_4_ < 0x357) && (local_919 = false, fps._0_4_ < 0x1e1)) {
        local_91a = 0.5 <= ABS(25.0 - (double)__range1) && 0.5 <= ABS(50.0 - (double)__range1);
        local_919 = local_91a;
      }
      fname_time._3_1_ = local_919;
      local_91b = false;
      if ((fps._4_4_ < 0x401) && (local_91b = false, fps._0_4_ < 0x241)) {
        local_91c = ABS(25.0 - (double)__range1) < 0.5 || ABS(50.0 - (double)__range1) < 0.5;
        local_91b = local_91c;
      }
      fname_time._2_1_ = local_91b;
      if (local_919 == false) {
        if (local_91b == false) {
          if (fps._4_4_ < 0x514) {
            puStack_80 = pattern_1280;
            fname_time._4_4_ = 0x151;
          }
          else {
            puStack_80 = pattern_1920;
            fname_time._4_4_ = 0x284;
          }
        }
        else {
          puStack_80 = pattern_pal;
          fname_time._4_4_ = 0xcc;
        }
      }
      else {
        puStack_80 = pattern_ntsc;
        fname_time._4_4_ = 0xba;
      }
      tmpFileName.field_2._8_8_ = std::chrono::_V2::system_clock::now();
      local_a0.__r = (rep)std::chrono::
                          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                              *)((long)&tmpFileName.field_2 + 8));
      local_98.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_a0);
      local_90 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"blank_",&local_129);
      std::operator+(&local_108,appDir,&local_128);
      std::__cxx11::to_string(&local_160,local_90);
      std::operator+(&local_e8,&local_108,&local_160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,".264",(allocator<char> *)((long)&file.m_pos + 7));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     &local_e8,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)((long)&file.m_pos + 7));
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator(&local_129);
      File::File((File *)local_1c0);
      __file = (uint8_t *)std::__cxx11::string::c_str();
      __n = 0;
      uVar2 = File::open((File *)local_1c0,(char *)__file,2);
      if ((uVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_338);
        poVar3 = std::operator<<((ostream *)local_338,"can\'t create file ");
        std::operator<<(poVar3,(string *)local_c8);
        pVVar4 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar4,3,(string *)&i);
        __cxa_throw(pVVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      local_360 = 0;
      while( true ) {
        if (2 < local_360) {
          File::close((File *)local_1c0,(int)__file);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_530);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_550,"insertSEI",&local_551);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_530,&local_550);
          std::__cxx11::string::~string((string *)&local_550);
          std::allocator<char>::~allocator(&local_551);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_578,"fps",(allocator<char> *)&muxerManager.field_0x2ef);
          this = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_530,&local_578);
          std::__cxx11::string::operator=((string *)this,"23.976");
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator((allocator<char> *)&muxerManager.field_0x2ef);
          MuxerManager::MuxerManager
                    ((MuxerManager *)local_870,&readManager,
                     &tsMuxerFactory.super_AbstractMuxerFactory);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_890,"MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500"
                     ,&local_891);
          MuxerManager::parseMuxOpt((MuxerManager *)local_870,&local_890);
          std::__cxx11::string::~string((string *)&local_890);
          std::allocator<char>::~allocator(&local_891);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_8b8,"V_MPEG4/ISO/AVC",
                     (allocator<char> *)(dstFile.field_2._M_local_buf + 0xf));
          MuxerManager::addStream
                    ((MuxerManager *)local_870,&local_8b8,(string *)local_c8,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_530);
          std::__cxx11::string::~string((string *)&local_8b8);
          std::allocator<char>::~allocator((allocator<char> *)(dstFile.field_2._M_local_buf + 0xf));
          BlurayHelper::m2tsFileName_abi_cxx11_((string *)&tsMuxer,blurayHelper,blankNum);
          MuxerManager::doMux((MuxerManager *)local_870,(string *)&tsMuxer,
                              &blurayHelper->super_FileFactory);
          pAVar6 = MuxerManager::getMainMuxer((MuxerManager *)local_870);
          if (pAVar6 == (AbstractMuxer *)0x0) {
            local_9a0 = (TSMuxer *)0x0;
          }
          else {
            local_9a0 = (TSMuxer *)
                        __dynamic_cast(pAVar6,&AbstractMuxer::typeinfo,&TSMuxer::typeinfo,0);
          }
          local_8e8 = local_9a0;
          local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<double,_std::allocator<double>_>::vector(&local_908);
          BlurayHelper::createMPLSFile
                    (blurayHelper,local_9a0,(TSMuxer *)0x0,0,&local_908,dt,blankNum,false);
          std::vector<double,_std::allocator<double>_>::~vector(&local_908);
          BlurayHelper::createCLPIFile(blurayHelper,local_8e8,blankNum,true);
          std::__cxx11::string::~string((string *)&tsMuxer);
          MuxerManager::~MuxerManager((MuxerManager *)local_870);
          deleteFile((string *)local_c8);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_530);
          File::~File((File *)local_1c0);
          std::__cxx11::string::~string((string *)local_c8);
          return;
        }
        __file = puStack_80;
        sVar5 = File::write((File *)local_1c0,(int)puStack_80,(void *)(ulong)fname_time._4_4_,__n);
        if ((uint)sVar5 != fname_time._4_4_) break;
        local_360 = local_360 + 1;
      }
      deleteFile((string *)local_c8);
      std::__cxx11::ostringstream::ostringstream(local_4d8);
      poVar3 = std::operator<<((ostream *)local_4d8,"can\'t write data to file ");
      std::operator<<(poVar3,(string *)local_c8);
      videoParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      pVVar4 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar4,3,&local_4f8);
      videoParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      __cxa_throw(pVVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    pid = &std::_Rb_tree_const_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator*(&__end1)->
           first;
    si = (type *)std::get<0ul,int_const,PMTStreamInfo>((pair<const_int,_PMTStreamInfo> *)pid);
    streamReader = (MPEGStreamReader *)
                   std::get<1ul,int_const,PMTStreamInfo>((pair<const_int,_PMTStreamInfo> *)pid);
    streamInfo = (PMTStreamInfo *)streamReader;
    if ((AbstractStreamReader *)streamReader->m_testPulldownDts == (AbstractStreamReader *)0x0) {
      local_918 = (long *)0x0;
    }
    else {
      local_918 = (long *)__dynamic_cast((AbstractStreamReader *)streamReader->m_testPulldownDts,
                                         &AbstractStreamReader::typeinfo,&MPEGStreamReader::typeinfo
                                        );
    }
    pattern = (uint8_t *)local_918;
    if (local_918 != (long *)0x0) {
      fps._4_4_ = (**(code **)(*local_918 + 0xa0))();
      fps._0_4_ = (**(code **)(*(long *)pattern + 0xa8))();
      __range1 = (PIDListMap *)MPEGStreamReader::getFPS((MPEGStreamReader *)pattern);
      goto LAB_002bcfec;
    }
    std::_Rb_tree_const_iterator<std::pair<const_int,_PMTStreamInfo>_>::operator++(&__end1);
  } while( true );
}

Assistant:

void muxBlankPL(const string& appDir, BlurayHelper& blurayHelper, const PIDListMap& pidList, DiskType dt, int blankNum)
{
    unsigned videoWidth = 1920;
    unsigned videoHeight = 1080;
    double fps = 23.976;
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& streamInfo = si;
        const auto streamReader = dynamic_cast<const MPEGStreamReader*>(streamInfo.m_codecReader);
        if (streamReader)
        {
            videoWidth = streamReader->getStreamWidth();
            videoHeight = streamReader->getStreamHeight();
            fps = streamReader->getFPS();
            break;
        }
    }
    uint8_t* pattern;
    int patternSize;
    bool isNtsc = videoWidth <= 854 && videoHeight <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    bool isPal = videoWidth <= 1024 && videoHeight <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
    {
        pattern = pattern_ntsc;
        patternSize = sizeof(pattern_ntsc);
    }
    else if (isPal)
    {
        pattern = pattern_pal;
        patternSize = sizeof(pattern_pal);
    }
    else if (videoWidth >= 1300)
    {
        pattern = pattern_1920;
        patternSize = sizeof(pattern_1920);
    }
    else
    {
        pattern = pattern_1280;
        patternSize = sizeof(pattern_1280);
    }
    auto fname_time = std::chrono::duration_cast<std::chrono::microseconds>(
                          std::chrono::high_resolution_clock::now().time_since_epoch())
                          .count();
    string tmpFileName = appDir + string("blank_") + std::to_string(fname_time) + string(".264");
    File file;
    if (!file.open(tmpFileName.c_str(), File::ofWrite))
        THROW(ERR_COMMON, "can't create file " << tmpFileName)
    for (int i = 0; i < 3; ++i)
    {
        if (file.write(pattern, patternSize) != patternSize)
        {
            deleteFile(tmpFileName);
            THROW(ERR_COMMON, "can't write data to file " << tmpFileName)
        }
    }
    file.close();
    map<string, string> videoParams;
    videoParams["insertSEI"];
    videoParams["fps"] = "23.976";
    {
        MuxerManager muxerManager(readManager, tsMuxerFactory);
        muxerManager.parseMuxOpt("MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500");
        muxerManager.addStream("V_MPEG4/ISO/AVC", tmpFileName, videoParams);
        string dstFile = blurayHelper.m2tsFileName(blankNum);
        muxerManager.doMux(dstFile, &blurayHelper);

        auto tsMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());

        blurayHelper.createMPLSFile(tsMuxer, nullptr, 0, vector<double>(), dt, blankNum, false);
        blurayHelper.createCLPIFile(tsMuxer, blankNum, true);
    }
    deleteFile(tmpFileName);
}